

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteSFixed32Array
               (int32 *a,int n,CodedOutputStream *output)

{
  io::CodedOutputStream::WriteRaw(output,a,n * 4);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32Array(const int32* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int32>(a, n, output);
}